

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_linear.c
# Opt level: O2

void mpt_values_linear(long points,double *target,long ld,double min,double max)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  
  if (0 < points && target != (double *)0x0) {
    lVar2 = points + -1;
    *target = min;
    pdVar1 = target + ld;
    for (lVar3 = 1; lVar3 < lVar2; lVar3 = lVar3 + 1) {
      *pdVar1 = (double)lVar3 * ((max - min) / (double)lVar2) + min;
      pdVar1 = pdVar1 + ld;
    }
    target[lVar2 * ld] = max;
  }
  return;
}

Assistant:

extern void mpt_values_linear(long points, double *target, long ld, double min, double max)
{
	long i, len;
	double dv;
	
	if (!target || points < 1) {
		return;
	}
	dv = (max - min) / (len = points - 1);
	
	target[0] = min;
	
	for (i = 1; i < len; i++) {
		target[i * ld] = min + i * dv;
	}
	target[len * ld] = max;
}